

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

FeatureSetDefaults * __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::ReadEditionDefaults
          (FeatureSetDefaults *__return_storage_ptr__,CommandLineInterfaceTest *this,
          string_view filename)

{
  bool bVar1;
  LogMessage *this_00;
  string_view data;
  string file_contents;
  LogMessage local_50;
  string local_40;
  
  FeatureSetDefaults::FeatureSetDefaults(__return_storage_ptr__);
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            (&local_40,this,filename);
  data._M_str = local_40._M_dataplus._M_p;
  data._M_len = local_40._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,data);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x167,"defaults.ParseFromString(file_contents)");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_50,(char (*) [32])"Could not parse file contents: ");
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,filename);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

FeatureSetDefaults CommandLineInterfaceTest::ReadEditionDefaults(
    absl::string_view filename) {
  FeatureSetDefaults defaults;
  std::string file_contents = ReadFile(filename);
  ABSL_CHECK(defaults.ParseFromString(file_contents))
      << "Could not parse file contents: " << filename;
  return defaults;
}